

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O2

void lightconf::config_format::write_vector(scanner *sc,writer *wr,value_vector_type *vec)

{
  pointer pvVar1;
  pointer pvVar2;
  int iVar3;
  char cVar4;
  writer *pwVar5;
  uint uVar6;
  ulong uVar7;
  allocator local_171;
  int local_170;
  int local_16c;
  writer *local_168;
  string local_160;
  scanner dummy_scanner;
  value local_c8;
  
  local_16c = vector_length(vec,0x78);
  local_170 = wr->wrap_length;
  std::__cxx11::string::string((string *)&dummy_scanner,"[ ",(allocator *)&local_160);
  writer::append(wr,&dummy_scanner.input_);
  std::__cxx11::string::~string((string *)&dummy_scanner);
  writer::indent(wr);
  if (local_170 < local_16c) {
    writer::newline(wr);
  }
  uVar6 = 0;
  local_168 = wr;
  scanner::expect(sc,'[',false);
  while( true ) {
    scanner::peek_token((token *)&dummy_scanner,sc);
    cVar4 = (char)dummy_scanner.tokens_.
                  super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    iVar3 = (int)dummy_scanner.input_._M_dataplus._M_p;
    std::__cxx11::string::~string((string *)&dummy_scanner.input_._M_string_length);
    pwVar5 = local_168;
    if ((iVar3 == 4) && (cVar4 == ']')) break;
    pvVar1 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)uVar6 <
        (ulong)(((long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x98)) {
      write_value(sc,local_168,pvVar1 + uVar6);
      uVar6 = uVar6 + 1;
    }
    else {
      read_value(&local_c8,sc);
      value::~value(&local_c8);
    }
    scanner::peek_token((token *)&dummy_scanner,sc);
    if (((int)dummy_scanner.input_._M_dataplus._M_p == 4) &&
       ((char)dummy_scanner.tokens_.
              super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == ']')) {
      pvVar1 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      pvVar2 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::~string((string *)&dummy_scanner.input_._M_string_length);
      pwVar5 = local_168;
      if (((long)pvVar1 - (long)pvVar2) / 0x98 != (ulong)uVar6) goto LAB_001160b9;
      if (local_16c <= local_170) {
        std::__cxx11::string::string((string *)&dummy_scanner," ",(allocator *)&local_160);
        writer::append(pwVar5,&dummy_scanner.input_);
        goto LAB_001160ec;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&dummy_scanner.input_._M_string_length);
LAB_001160b9:
      if (local_170 < local_16c) {
        writer::newline(pwVar5);
      }
      else {
        std::__cxx11::string::string((string *)&dummy_scanner,", ",(allocator *)&local_160);
        writer::append(pwVar5,&dummy_scanner.input_);
LAB_001160ec:
        std::__cxx11::string::~string((string *)&dummy_scanner);
      }
    }
    scanner::expect(sc,',',true);
  }
  do {
    uVar7 = (ulong)uVar6;
    if ((ulong)(((long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)
                      ._M_impl.super__Vector_impl_data._M_start) / 0x98) <= uVar7) {
      std::deque<int,_std::allocator<int>_>::pop_back(&(pwVar5->tabstops).c);
      if (local_170 < local_16c) {
        writer::newline(pwVar5);
      }
      scanner::expect(sc,']',false);
      std::__cxx11::string::string((string *)&dummy_scanner,"]",(allocator *)&local_160);
      writer::append(pwVar5,&dummy_scanner.input_);
      std::__cxx11::string::~string((string *)&dummy_scanner);
      return;
    }
    std::__cxx11::string::string((string *)&local_160,"0",&local_171);
    make_scanner(&dummy_scanner,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    write_value(&dummy_scanner,pwVar5,
                (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                _M_impl.super__Vector_impl_data._M_start + uVar7);
    if (uVar7 < ((long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)
                      ._M_impl.super__Vector_impl_data._M_start) / 0x98 - 1U) {
      if (local_170 < local_16c) {
        writer::newline(pwVar5);
      }
      else {
        std::__cxx11::string::string((string *)&local_160,", ",&local_171);
        writer::append(pwVar5,&local_160);
LAB_001161e5:
        std::__cxx11::string::~string((string *)&local_160);
      }
    }
    else if (local_16c <= local_170) {
      std::__cxx11::string::string((string *)&local_160," ",&local_171);
      writer::append(pwVar5,&local_160);
      goto LAB_001161e5;
    }
    scanner::~scanner(&dummy_scanner);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

inline void write_vector(scanner& sc, writer& wr, const value_vector_type& vec) {
    bool wrap = vector_length(vec) > wr.wrap_length;

    wr.append("[ ");
    wr.indent();
    if (wrap) {
        wr.newline();
    }
    sc.expect('[');

    unsigned int vals_read = 0;
    while (!sc.peek_token().is_char(']')) {
        if (vals_read < vec.size()) {
            write_value(sc, wr, vec[vals_read]);
            vals_read++;
        } else {
            read_value(sc);
        }

        bool terminate = sc.peek_token().is_char(']') && vals_read == vec.size();
        if (!terminate) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
        sc.expect(',', true);
    }

    for (unsigned int i = vals_read; i < vec.size(); i++) {
        scanner dummy_scanner = make_scanner("0");
        write_value(dummy_scanner, wr, vec[i]);
        if (i < vec.size() - 1) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
    }

    wr.unindent();
    if (wrap) {
        wr.newline();
    }

    sc.expect(']');
    wr.append("]");
}